

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportCommand.cxx
# Opt level: O2

bool __thiscall
cmExportCommand::HandlePackage
          (cmExportCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *pcVar1;
  bool bVar2;
  bool bVar3;
  PolicyStatus PVar4;
  ostream *poVar5;
  string *input;
  ulong uVar6;
  long lVar7;
  string package;
  string local_298;
  string hash;
  RegularExpression packageRegex;
  
  package._M_dataplus._M_p = (pointer)&package.field_2;
  package._M_string_length = 0;
  package.field_2._M_local_buf[0] = '\0';
  lVar7 = 0x20;
  for (uVar6 = 1;
      uVar6 < (ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5); uVar6 = uVar6 + 1) {
    if ((int)uVar6 == 2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&hash);
      poVar5 = std::operator<<((ostream *)&hash,"PACKAGE given unknown argument: ");
      std::operator<<(poVar5,(string *)
                             ((long)&(((args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                     _M_p + lVar7));
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,(string *)&packageRegex);
      std::__cxx11::string::~string((string *)&packageRegex);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&hash);
      goto LAB_001f1741;
    }
    std::__cxx11::string::_M_assign((string *)&package);
    lVar7 = lVar7 + 0x20;
  }
  if (package._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&hash,"PACKAGE must be given a package name.",
               (allocator<char> *)&packageRegex);
    cmCommand::SetError(&this->super_cmCommand,&hash);
    std::__cxx11::string::~string((string *)&hash);
LAB_001f1741:
    bVar2 = false;
    goto LAB_001f185d;
  }
  cmsys::RegularExpression::RegularExpression(&packageRegex,"^[A-Za-z0-9_.-]+$");
  bVar2 = cmsys::RegularExpression::find(&packageRegex,package._M_dataplus._M_p);
  if (bVar2) {
    PVar4 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0090,false);
    if (PVar4 - NEW < 3) {
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&hash,"CMAKE_EXPORT_PACKAGE_REGISTRY",(allocator<char> *)&local_298);
      bVar3 = cmMakefile::IsOn(pcVar1,&hash);
      std::__cxx11::string::~string((string *)&hash);
      if (!bVar3) goto LAB_001f1850;
    }
    else if (PVar4 < NEW) {
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&hash,"CMAKE_EXPORT_NO_PACKAGE_REGISTRY",(allocator<char> *)&local_298);
      bVar3 = cmMakefile::IsOn(pcVar1,&hash);
      std::__cxx11::string::~string((string *)&hash);
      if (bVar3) goto LAB_001f1850;
    }
    input = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
    cmSystemTools::ComputeStringMD5(&hash,input);
    StorePackageRegistryDir(this,&package,(input->_M_dataplus)._M_p,hash._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&hash);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&hash);
    poVar5 = std::operator<<((ostream *)&hash,"PACKAGE given invalid package name \"");
    poVar5 = std::operator<<(poVar5,(string *)&package);
    poVar5 = std::operator<<(poVar5,"\".  ");
    poVar5 = std::operator<<(poVar5,"Package names must match \"");
    poVar5 = std::operator<<(poVar5,"^[A-Za-z0-9_.-]+$");
    std::operator<<(poVar5,"\".");
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&hash);
  }
LAB_001f1850:
  cmsys::RegularExpression::~RegularExpression(&packageRegex);
LAB_001f185d:
  std::__cxx11::string::~string((string *)&package);
  return bVar2;
}

Assistant:

bool cmExportCommand::HandlePackage(std::vector<std::string> const& args)
{
  // Parse PACKAGE mode arguments.
  enum Doing
  {
    DoingNone,
    DoingPackage
  };
  Doing doing = DoingPackage;
  std::string package;
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (doing == DoingPackage) {
      package = args[i];
      doing = DoingNone;
    } else {
      std::ostringstream e;
      e << "PACKAGE given unknown argument: " << args[i];
      this->SetError(e.str());
      return false;
    }
  }

  // Verify the package name.
  if (package.empty()) {
    this->SetError("PACKAGE must be given a package name.");
    return false;
  }
  const char* packageExpr = "^[A-Za-z0-9_.-]+$";
  cmsys::RegularExpression packageRegex(packageExpr);
  if (!packageRegex.find(package)) {
    std::ostringstream e;
    e << "PACKAGE given invalid package name \"" << package << "\".  "
      << "Package names must match \"" << packageExpr << "\".";
    this->SetError(e.str());
    return false;
  }

  // CMP0090 decides both the default and what variable changes it.
  switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0090)) {
    case cmPolicies::WARN:
    case cmPolicies::OLD:
      // Default is to export, but can be disabled.
      if (this->Makefile->IsOn("CMAKE_EXPORT_NO_PACKAGE_REGISTRY")) {
        return true;
      }
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      // Default is to not export, but can be enabled.
      if (!this->Makefile->IsOn("CMAKE_EXPORT_PACKAGE_REGISTRY")) {
        return true;
      }
      break;
  }

  // We store the current build directory in the registry as a value
  // named by a hash of its own content.  This is deterministic and is
  // unique with high probability.
  const std::string& outDir = this->Makefile->GetCurrentBinaryDirectory();
  std::string hash = cmSystemTools::ComputeStringMD5(outDir);
#if defined(_WIN32) && !defined(__CYGWIN__)
  this->StorePackageRegistryWin(package, outDir.c_str(), hash.c_str());
#else
  this->StorePackageRegistryDir(package, outDir.c_str(), hash.c_str());
#endif

  return true;
}